

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O1

void __thiscall
pybind11::cpp_function::initialize_generic
          (cpp_function *this,function_record *rec,char *text,type_info **types,size_t args)

{
  byte bVar1;
  pointer paVar2;
  void *__ptr;
  uint __val;
  size_t sVar3;
  undefined1 auVar4 [8];
  uint uVar5;
  char cVar6;
  int iVar7;
  uint uVar8;
  char *pcVar9;
  long *plVar10;
  type_info *ptVar11;
  handle *phVar12;
  function_record *pfVar13;
  function_record *pfVar14;
  PyMethodDef *pPVar15;
  object *poVar16;
  PyObject *pPVar17;
  size_type *psVar18;
  PyObject *pPVar19;
  ulong uVar20;
  PyTypeObject *pPVar21;
  type_info *ptVar22;
  object *object;
  pointer paVar23;
  char cVar24;
  undefined8 uVar25;
  uint __len;
  ulong __val_00;
  function_record *pfVar26;
  uint uVar27;
  ulong uVar28;
  bool bVar29;
  accessor<pybind11::detail::accessor_policies::str_attr> local_1d0;
  string local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  size_t local_150;
  str local_148;
  undefined1 local_140 [24];
  object local_128;
  function_record *local_120;
  vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
  *local_118;
  cpp_function *local_110;
  undefined1 local_108 [8];
  string signature;
  undefined1 local_e0 [16];
  undefined1 local_d0 [23];
  allocator local_b9;
  long local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  _Alloc_hider local_90;
  object scope_module;
  undefined8 local_80;
  undefined8 uStack_78;
  _Alloc_hider local_70;
  capsule rec_capsule_1;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined1 local_50 [8];
  string signatures;
  
  pcVar9 = "";
  if (rec->name != (char *)0x0) {
    pcVar9 = rec->name;
  }
  local_150 = args;
  local_120 = (function_record *)types;
  local_110 = this;
  pcVar9 = strdup(pcVar9);
  rec->name = pcVar9;
  if (rec->doc != (char *)0x0) {
    pcVar9 = strdup(rec->doc);
    rec->doc = pcVar9;
  }
  paVar23 = (rec->args).
            super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
            ._M_impl.super__Vector_impl_data._M_start;
  paVar2 = (rec->args).
           super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  signature.field_2._8_8_ = rec;
  if (paVar23 != paVar2) {
    do {
      if (paVar23->name != (char *)0x0) {
        pcVar9 = strdup(paVar23->name);
        paVar23->name = pcVar9;
      }
      if (paVar23->descr == (char *)0x0) {
        if ((paVar23->value).m_ptr != (PyObject *)0x0) {
          signatures._M_dataplus._M_p = (pointer)(paVar23->value).m_ptr;
          signatures._M_string_length = (size_type)anon_var_dwarf_3c21a;
          signatures.field_2._M_allocated_capacity = 0;
          detail::
          object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>::
          operator()((object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>
                      *)&stack0xffffffffffffff90);
          cast<std::__cxx11::string>
                    ((enable_if_t<detail::move_if_unreferenced<basic_string<char>_>::value,_std::__cxx11::basic_string<char>_>
                      *)local_108,(pybind11 *)&stack0xffffffffffffff90,object);
          auVar4 = local_108;
          pcVar9 = strdup((char *)local_108);
          paVar23->descr = pcVar9;
          if (auVar4 != (undefined1  [8])&signature._M_string_length) {
            operator_delete((void *)auVar4,
                            CONCAT71(signature._M_string_length._1_7_,
                                     (undefined1)signature._M_string_length) + 1);
          }
          pybind11::object::~object((object *)&stack0xffffffffffffff90);
          pybind11::object::~object((object *)&signatures.field_2._M_allocated_capacity);
          rec = (function_record *)signature.field_2._8_8_;
        }
      }
      else {
        pcVar9 = strdup(paVar23->descr);
        paVar23->descr = pcVar9;
      }
      paVar23 = paVar23 + 1;
    } while (paVar23 != paVar2);
  }
  pcVar9 = rec->name;
  iVar7 = strcmp(pcVar9,"__init__");
  if (iVar7 == 0) {
    bVar29 = true;
  }
  else {
    iVar7 = strcmp(pcVar9,"__setstate__");
    bVar29 = iVar7 == 0;
  }
  bVar1 = rec->field_0x59;
  rec->field_0x59 = bVar1 & 0xfe | bVar29;
  if (((bVar1 & 2) == 0 & bVar29) == 1) {
    std::__cxx11::string::string
              ((string *)local_108,(char *)(rec->scope).m_ptr[1].ob_type,(allocator *)local_50);
    std::__cxx11::string::string((string *)local_50,rec->name,(allocator *)&stack0xffffffffffffff90)
    ;
    uVar25 = _PyExc_FutureWarning;
    std::operator+(&local_b0,"pybind11-bound class \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108);
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_b0);
    pPVar17 = (PyObject *)(plVar10 + 2);
    if ((PyObject *)*plVar10 == pPVar17) {
      local_d0._0_8_ = pPVar17->ob_refcnt;
      local_d0._8_8_ = plVar10[3];
      local_e0._0_8_ = (PyObject *)local_d0;
    }
    else {
      local_d0._0_8_ = pPVar17->ob_refcnt;
      local_e0._0_8_ = (PyObject *)*plVar10;
    }
    local_e0._8_8_ = plVar10[1];
    *plVar10 = (long)pPVar17;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::_M_append(local_e0,(ulong)local_50);
    psVar18 = (size_type *)(plVar10 + 2);
    if ((size_type *)*plVar10 == psVar18) {
      local_80 = *psVar18;
      uStack_78 = plVar10[3];
      local_90._M_p = (pointer)&stack0xffffffffffffff80;
    }
    else {
      local_80 = *psVar18;
      local_90._M_p = (pointer)*plVar10;
    }
    scope_module.super_handle.m_ptr = (handle)plVar10[1];
    *plVar10 = (long)psVar18;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&stack0xffffffffffffff70);
    pPVar17 = (PyObject *)(plVar10 + 2);
    if ((PyObject *)*plVar10 == pPVar17) {
      local_60 = pPVar17->ob_refcnt;
      uStack_58 = plVar10[3];
      local_70._M_p = (pointer)&stack0xffffffffffffffa0;
    }
    else {
      local_60 = pPVar17->ob_refcnt;
      local_70._M_p = (pointer)*plVar10;
    }
    rec_capsule_1.super_object.super_handle.m_ptr = (object)((handle *)(plVar10 + 1))->m_ptr;
    *plVar10 = (long)pPVar17;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    PyErr_WarnEx(uVar25,local_70._M_p,0);
    if ((PyObject *)local_70._M_p != (PyObject *)&stack0xffffffffffffffa0) {
      operator_delete(local_70._M_p,local_60 + 1);
    }
    if (local_90._M_p != (pointer)&stack0xffffffffffffff80) {
      operator_delete(local_90._M_p,local_80 + 1);
    }
    rec = (function_record *)signature.field_2._8_8_;
    if ((PyObject *)local_e0._0_8_ != (PyObject *)local_d0) {
      operator_delete((void *)local_e0._0_8_,(ulong)(local_d0._0_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if (local_50 != (undefined1  [8])&signatures._M_string_length) {
      operator_delete((void *)local_50,signatures._M_string_length + 1);
    }
    if (local_108 != (undefined1  [8])&signature._M_string_length) {
      operator_delete((void *)local_108,
                      CONCAT71(signature._M_string_length._1_7_,
                               (undefined1)signature._M_string_length) + 1);
    }
  }
  local_118 = &rec->args;
  local_108 = (undefined1  [8])&signature._M_string_length;
  signature._M_dataplus._M_p = (pointer)0x0;
  signature._M_string_length._0_1_ = 0;
  uVar28 = 0;
  local_b8 = 0;
  do {
    sVar3 = local_150;
    bVar1 = *text;
    if (bVar1 < 0x7b) {
      if (bVar1 == 0x25) {
        pPVar21 = *(PyTypeObject **)((long)local_120 + local_b8 * 8);
        if (pPVar21 == (PyTypeObject *)0x0) {
          pybind11_fail("Internal error while parsing type signature (1)");
        }
        local_50 = (undefined1  [8])pPVar21;
        ptVar11 = detail::get_type_info((type_index *)local_50,false);
        local_b8 = local_b8 + 1;
        if (ptVar11 == (type_info *)0x0) {
          if ((uVar28 == 0 & (byte)rec->field_0x59 >> 1) != 1) {
            pPVar21 = (pPVar21->ob_base).ob_base.ob_type;
            std::__cxx11::string::string
                      ((string *)local_50,
                       (char *)((long)&(pPVar21->ob_base).ob_base.ob_refcnt +
                               (ulong)((char)(pPVar21->ob_base).ob_base.ob_refcnt == '*')),
                       (allocator *)&stack0xffffffffffffff90);
            detail::clean_type_id((string *)local_50);
            std::__cxx11::string::_M_append(local_108,(ulong)local_50);
            if (local_50 != (undefined1  [8])&signatures._M_string_length) {
              operator_delete((void *)local_50,signatures._M_string_length + 1);
            }
            goto LAB_0010baa1;
          }
          local_e0._8_8_ = (rec->scope).m_ptr;
          local_d0._0_8_ = "__module__";
          local_d0._8_8_ = (PyObject *)0x0;
          phVar12 = &detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                               ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_e0)
                     ->super_handle;
          cast<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &stack0xffffffffffffff70,phVar12);
          plVar10 = (long *)std::__cxx11::string::append((char *)&stack0xffffffffffffff70);
          local_70._M_p = (pointer)&stack0xffffffffffffffa0;
          pPVar17 = (PyObject *)(plVar10 + 2);
          if ((PyObject *)*plVar10 == pPVar17) {
            local_60 = pPVar17->ob_refcnt;
            uStack_58 = plVar10[3];
          }
          else {
            local_60 = pPVar17->ob_refcnt;
            local_70._M_p = (pointer)*plVar10;
          }
          rec_capsule_1.super_object.super_handle.m_ptr = (object)((handle *)(plVar10 + 1))->m_ptr;
          *plVar10 = (long)pPVar17;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          local_140._8_8_ = (rec->scope).m_ptr;
          local_140._16_8_ = "__qualname__";
          local_128.super_handle.m_ptr = (handle)(PyObject *)0x0;
          phVar12 = &detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                               ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_140
                               )->super_handle;
          cast<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&local_b0,phVar12);
          uVar25 = 0xf;
          if ((PyObject *)local_70._M_p != (PyObject *)&stack0xffffffffffffffa0) {
            uVar25 = local_60;
          }
          if ((ulong)uVar25 <
              local_b0._M_string_length + (long)rec_capsule_1.super_object.super_handle.m_ptr) {
            uVar25 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
              uVar25 = local_b0.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar25 <
                local_b0._M_string_length + (long)rec_capsule_1.super_object.super_handle.m_ptr)
            goto LAB_0010b8b3;
            plVar10 = (long *)std::__cxx11::string::replace
                                        ((ulong)&local_b0,0,(char *)0x0,(ulong)local_70._M_p);
          }
          else {
LAB_0010b8b3:
            plVar10 = (long *)std::__cxx11::string::_M_append
                                        ((char *)&stack0xffffffffffffff90,
                                         (ulong)local_b0._M_dataplus._M_p);
          }
          local_50 = (undefined1  [8])&signatures._M_string_length;
          pPVar21 = (PyTypeObject *)(plVar10 + 2);
          if ((PyTypeObject *)*plVar10 == pPVar21) {
            signatures._M_string_length = (pPVar21->ob_base).ob_base.ob_refcnt;
            signatures.field_2._M_allocated_capacity = plVar10[3];
          }
          else {
            signatures._M_string_length = (pPVar21->ob_base).ob_base.ob_refcnt;
            local_50 = (undefined1  [8])*plVar10;
          }
          signatures._M_dataplus._M_p = (pointer)plVar10[1];
          *plVar10 = (long)pPVar21;
          plVar10[1] = 0;
          *(undefined1 *)&(pPVar21->ob_base).ob_base.ob_refcnt = 0;
          std::__cxx11::string::_M_append(local_108,(ulong)local_50);
        }
        else {
          pPVar21 = ptVar11->type;
          local_d0._0_8_ = "__module__";
          local_d0._8_8_ = (PyObject *)0x0;
          local_e0._8_8_ = pPVar21;
          phVar12 = &detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                               ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_e0)
                     ->super_handle;
          cast<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &stack0xffffffffffffff70,phVar12);
          plVar10 = (long *)std::__cxx11::string::append((char *)&stack0xffffffffffffff70);
          local_70._M_p = (pointer)&stack0xffffffffffffffa0;
          pPVar17 = (PyObject *)(plVar10 + 2);
          if ((PyObject *)*plVar10 == pPVar17) {
            local_60 = pPVar17->ob_refcnt;
            uStack_58 = plVar10[3];
          }
          else {
            local_60 = pPVar17->ob_refcnt;
            local_70._M_p = (pointer)*plVar10;
          }
          rec_capsule_1.super_object.super_handle.m_ptr = (object)((handle *)(plVar10 + 1))->m_ptr;
          *plVar10 = (long)pPVar17;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          local_140._16_8_ = "__qualname__";
          local_128.super_handle.m_ptr = (handle)(PyObject *)0x0;
          local_140._8_8_ = pPVar21;
          phVar12 = &detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                               ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_140
                               )->super_handle;
          cast<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&local_b0,phVar12);
          uVar25 = 0xf;
          if ((PyObject *)local_70._M_p != (PyObject *)&stack0xffffffffffffffa0) {
            uVar25 = local_60;
          }
          if ((ulong)uVar25 <
              local_b0._M_string_length + (long)rec_capsule_1.super_object.super_handle.m_ptr) {
            uVar25 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
              uVar25 = local_b0.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar25 <
                local_b0._M_string_length + (long)rec_capsule_1.super_object.super_handle.m_ptr)
            goto LAB_0010b724;
            plVar10 = (long *)std::__cxx11::string::replace
                                        ((ulong)&local_b0,0,(char *)0x0,(ulong)local_70._M_p);
          }
          else {
LAB_0010b724:
            plVar10 = (long *)std::__cxx11::string::_M_append
                                        ((char *)&stack0xffffffffffffff90,
                                         (ulong)local_b0._M_dataplus._M_p);
          }
          local_50 = (undefined1  [8])&signatures._M_string_length;
          pPVar21 = (PyTypeObject *)(plVar10 + 2);
          if ((PyTypeObject *)*plVar10 == pPVar21) {
            signatures._M_string_length = (pPVar21->ob_base).ob_base.ob_refcnt;
            signatures.field_2._M_allocated_capacity = plVar10[3];
          }
          else {
            signatures._M_string_length = (pPVar21->ob_base).ob_base.ob_refcnt;
            local_50 = (undefined1  [8])*plVar10;
          }
          signatures._M_dataplus._M_p = (pointer)plVar10[1];
          *plVar10 = (long)pPVar21;
          plVar10[1] = 0;
          *(undefined1 *)&(pPVar21->ob_base).ob_base.ob_refcnt = 0;
          std::__cxx11::string::_M_append(local_108,(ulong)local_50);
        }
        if (local_50 != (undefined1  [8])&signatures._M_string_length) {
          operator_delete((void *)local_50,signatures._M_string_length + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        pybind11::object::~object(&local_128);
        if ((PyObject *)local_70._M_p != (PyObject *)&stack0xffffffffffffffa0) {
          operator_delete(local_70._M_p,local_60 + 1);
        }
        if (local_90._M_p != (pointer)&stack0xffffffffffffff80) {
          operator_delete(local_90._M_p,local_80 + 1);
        }
        pybind11::object::~object((object *)(local_d0 + 8));
      }
      else {
        if (bVar1 == 0) break;
LAB_0010b5da:
        std::__cxx11::string::push_back((char)local_108);
      }
    }
    else if (bVar1 == 0x7b) {
      if (((byte *)text)[1] != 0x2a) {
        paVar23 = (rec->args).
                  super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (((uVar28 < (ulong)((long)(rec->args).
                                     super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)paVar23 >> 5
                              )) && (paVar23[uVar28].name != (char *)0x0)) ||
           ((uVar28 == 0 && ((rec->field_0x59 & 0x40) != 0)))) {
          std::__cxx11::string::append(local_108);
        }
        else {
          __val_00 = uVar28 - (((byte)rec->field_0x59 >> 6 & 1) != 0);
          cVar24 = '\x01';
          if (9 < __val_00) {
            uVar20 = __val_00;
            cVar6 = '\x04';
            do {
              cVar24 = cVar6;
              if (uVar20 < 100) {
                cVar24 = cVar24 + -2;
                goto LAB_0010b9c0;
              }
              if (uVar20 < 1000) {
                cVar24 = cVar24 + -1;
                goto LAB_0010b9c0;
              }
              if (uVar20 < 10000) goto LAB_0010b9c0;
              bVar29 = 99999 < uVar20;
              uVar20 = uVar20 / 10000;
              cVar6 = cVar24 + '\x04';
            } while (bVar29);
            cVar24 = cVar24 + '\x01';
          }
LAB_0010b9c0:
          local_70._M_p = (pointer)&stack0xffffffffffffffa0;
          std::__cxx11::string::_M_construct((ulong)&stack0xffffffffffffff90,cVar24);
          std::__detail::__to_chars_10_impl<unsigned_long>
                    (local_70._M_p,(uint)rec_capsule_1.super_object.super_handle.m_ptr,__val_00);
          plVar10 = (long *)std::__cxx11::string::replace
                                      ((ulong)&stack0xffffffffffffff90,0,(char *)0x0,0x1188e2);
          rec = (function_record *)signature.field_2._8_8_;
          local_50 = (undefined1  [8])&signatures._M_string_length;
          pPVar21 = (PyTypeObject *)(plVar10 + 2);
          if ((PyTypeObject *)*plVar10 == pPVar21) {
            signatures._M_string_length = (pPVar21->ob_base).ob_base.ob_refcnt;
            signatures.field_2._M_allocated_capacity = plVar10[3];
          }
          else {
            signatures._M_string_length = (pPVar21->ob_base).ob_base.ob_refcnt;
            local_50 = (undefined1  [8])*plVar10;
          }
          signatures._M_dataplus._M_p = (pointer)plVar10[1];
          *plVar10 = (long)pPVar21;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          std::__cxx11::string::_M_append(local_108,(ulong)local_50);
          if (local_50 != (undefined1  [8])&signatures._M_string_length) {
            operator_delete((void *)local_50,signatures._M_string_length + 1);
          }
          if ((PyObject *)local_70._M_p != (PyObject *)&stack0xffffffffffffffa0) {
            operator_delete(local_70._M_p,local_60 + 1);
          }
        }
        std::__cxx11::string::append(local_108);
      }
    }
    else {
      if (bVar1 != 0x7d) goto LAB_0010b5da;
      paVar23 = (rec->args).
                super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((uVar28 < (ulong)((long)(rec->args).
                                  super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)paVar23 >> 5))
         && (paVar23[uVar28].descr != (char *)0x0)) {
        std::__cxx11::string::append(local_108);
        std::__cxx11::string::append(local_108);
      }
      uVar28 = uVar28 + 1;
    }
LAB_0010baa1:
    text = (char *)((byte *)text + 1);
  } while( true );
  if ((uVar28 != local_150) || (*(type_info **)((long)local_120 + local_b8 * 8) != (type_info *)0x0)
     ) {
    pybind11_fail("Internal error while parsing type signature (2)");
  }
  pcVar9 = strdup((char *)local_108);
  rec->signature = pcVar9;
  if ((rec->args).
      super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage !=
      (rec->args).
      super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    __shrink_to_fit_aux<std::vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>,_true>
    ::_S_do_it(local_118);
  }
  rec->nargs = (uint16_t)sVar3;
  pPVar17 = (rec->sibling).m_ptr;
  if ((pPVar17 != (PyObject *)0x0) && (pPVar17->ob_type == (PyTypeObject *)&PyInstanceMethod_Type))
  {
    (rec->sibling).m_ptr = (PyObject *)pPVar17[1].ob_refcnt;
  }
  pPVar17 = (rec->sibling).m_ptr;
  if (pPVar17 == (PyObject *)0x0) {
LAB_0010bbaa:
    pfVar26 = (function_record *)0x0;
  }
  else {
    pPVar21 = pPVar17->ob_type;
    if ((pPVar21 != (PyTypeObject *)&PyCFunction_Type) &&
       (iVar7 = PyType_IsSubtype(pPVar21,&PyCFunction_Type), iVar7 == 0)) {
      if (((rec->sibling).m_ptr != (PyObject *)&_Py_NoneStruct) && (*rec->name != '_')) {
        std::__cxx11::string::string
                  ((string *)&stack0xffffffffffffff70,rec->name,(allocator *)local_e0);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &stack0xffffffffffffff90,"Cannot overload existing non-function object \"",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &stack0xffffffffffffff70);
        plVar10 = (long *)std::__cxx11::string::append((char *)&stack0xffffffffffffff90);
        local_50 = (undefined1  [8])*plVar10;
        ptVar22 = (type_info *)(plVar10 + 2);
        if (local_50 == (undefined1  [8])ptVar22) {
          signatures._M_string_length = *(size_type *)ptVar22;
          signatures.field_2._M_allocated_capacity = plVar10[3];
          local_50 = (undefined1  [8])&signatures._M_string_length;
        }
        else {
          signatures._M_string_length = *(size_type *)ptVar22;
        }
        signatures._M_dataplus._M_p = (pointer)plVar10[1];
        *plVar10 = (long)ptVar22;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        pybind11_fail((string *)local_50);
      }
      goto LAB_0010bbaa;
    }
    pPVar17 = (rec->sibling).m_ptr;
    if ((*(byte *)(pPVar17[1].ob_refcnt + 0x10) & 0x20) == 0) {
      local_50 = (undefined1  [8])pPVar17[1].ob_type;
    }
    else {
      local_50 = (undefined1  [8])0x0;
    }
    if (local_50 != (undefined1  [8])0x0) {
      (((PyTypeObject *)local_50)->ob_base).ob_base.ob_refcnt =
           (((PyTypeObject *)local_50)->ob_base).ob_base.ob_refcnt + 1;
    }
    pfVar13 = capsule::operator_cast_to_function_record_((capsule *)local_50);
    pfVar26 = (function_record *)0x0;
    if ((pfVar13->scope).m_ptr == (rec->scope).m_ptr) {
      pfVar26 = pfVar13;
    }
    pybind11::object::~object((object *)local_50);
  }
  if (pfVar26 != (function_record *)0x0) {
    pPVar17 = (rec->sibling).m_ptr;
    (local_110->super_function).super_object.super_handle.m_ptr = pPVar17;
    if (pPVar17 != (PyObject *)0x0) {
      pPVar17->ob_refcnt = pPVar17->ob_refcnt + 1;
    }
    bVar1 = rec->field_0x59;
    pfVar13 = pfVar26;
    if (((pfVar26->field_0x59 ^ bVar1) & 0x40) != 0) {
      pcVar9 = "instance";
      if ((bVar1 & 0x40) == 0) {
        pcVar9 = "static";
      }
      local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_170,pcVar9,pcVar9 + (ulong)((bVar1 & 0x40) >> 6) * 2 + 6);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140,
                     "overloading a method with both static and instance methods is not supported; error while attempting to bind "
                     ,&local_170);
      plVar10 = (long *)std::__cxx11::string::append(local_140);
      local_b0._M_dataplus._M_p = (pointer)*plVar10;
      psVar18 = (size_type *)(plVar10 + 2);
      if ((size_type *)local_b0._M_dataplus._M_p == psVar18) {
        local_b0.field_2._M_allocated_capacity = *psVar18;
        local_b0.field_2._8_8_ = plVar10[3];
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      }
      else {
        local_b0.field_2._M_allocated_capacity = *psVar18;
      }
      local_b0._M_string_length = plVar10[1];
      *plVar10 = (long)psVar18;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      local_1d0.obj.m_ptr = *(PyObject **)(signature.field_2._8_8_ + 0x68);
      local_1d0.key = "__name__";
      local_1d0.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
      str::str<pybind11::detail::accessor_policies::str_attr>(&local_148,&local_1d0);
      str::operator_cast_to_string(&local_1b0,&local_148);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
                     &local_b0,&local_1b0);
      plVar10 = (long *)std::__cxx11::string::append(local_e0);
      local_90._M_p = (pointer)*plVar10;
      psVar18 = (size_type *)(plVar10 + 2);
      if ((size_type *)local_90._M_p == psVar18) {
        local_80 = *psVar18;
        uStack_78 = plVar10[3];
        local_90._M_p = (pointer)&stack0xffffffffffffff80;
      }
      else {
        local_80 = *psVar18;
      }
      scope_module.super_handle.m_ptr = (handle)plVar10[1];
      *plVar10 = (long)psVar18;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      std::__cxx11::string::string((string *)&local_190,*(char **)signature.field_2._8_8_,&local_b9)
      ;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &stack0xffffffffffffff90,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &stack0xffffffffffffff70,&local_190);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &stack0xffffffffffffff90,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108)
      ;
      pybind11_fail((string *)local_50);
    }
    do {
      pfVar14 = pfVar13;
      pfVar13 = pfVar14->next;
    } while (pfVar13 != (function_record *)0x0);
    pfVar14->next = rec;
    pfVar13 = pfVar26;
    goto LAB_0010bd48;
  }
  pPVar15 = (PyMethodDef *)operator_new(0x20);
  *(undefined8 *)&pPVar15->ml_flags = 0;
  pPVar15->ml_doc = (char *)0x0;
  pPVar15->ml_name = (char *)0x0;
  pPVar15->ml_meth = (PyCFunction)0x0;
  rec->def = pPVar15;
  *(undefined8 *)&pPVar15->ml_flags = 0;
  pPVar15->ml_doc = (char *)0x0;
  pPVar15->ml_name = (char *)0x0;
  pPVar15->ml_meth = (PyCFunction)0x0;
  pPVar15->ml_name = rec->name;
  pPVar15->ml_meth = dispatcher;
  pPVar15->ml_flags = 3;
  capsule::capsule((capsule *)&stack0xffffffffffffff90,rec,
                   initialize_generic::anon_class_1_0_00000001::__invoke);
  local_90._M_p = (pointer)0x0;
  pPVar17 = (rec->scope).m_ptr;
  if (pPVar17 != (PyObject *)0x0) {
    iVar7 = PyObject_HasAttrString(pPVar17,"__module__");
    if (iVar7 == 1) {
      signatures._M_dataplus._M_p = (pointer)(rec->scope).m_ptr;
      signatures._M_string_length = (size_type)anon_var_dwarf_3b9fe;
      signatures.field_2._M_allocated_capacity = 0;
      poVar16 = detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                          ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_50);
    }
    else {
      iVar7 = PyObject_HasAttrString((rec->scope).m_ptr,"__name__");
      if (iVar7 != 1) goto LAB_0010bd06;
      signatures._M_dataplus._M_p = (pointer)(rec->scope).m_ptr;
      signatures._M_string_length = (size_type)anon_var_dwarf_3b6c2;
      signatures.field_2._M_allocated_capacity = 0;
      poVar16 = detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                          ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_50);
    }
    local_e0._0_8_ = (poVar16->super_handle).m_ptr;
    if ((PyObject *)local_e0._0_8_ != (PyObject *)0x0) {
      ((PyObject *)local_e0._0_8_)->ob_refcnt = ((PyObject *)local_e0._0_8_)->ob_refcnt + 1;
    }
    pybind11::object::operator=((object *)&stack0xffffffffffffff70,(object *)local_e0);
    pybind11::object::~object((object *)local_e0);
    pybind11::object::~object((object *)&signatures.field_2._M_allocated_capacity);
  }
LAB_0010bd06:
  pPVar17 = (PyObject *)PyCMethod_New(rec->def,local_70._M_p,local_90._M_p,0);
  (local_110->super_function).super_object.super_handle.m_ptr = pPVar17;
  if (pPVar17 == (PyObject *)0x0) {
    pybind11_fail("cpp_function::cpp_function(): Could not allocate function object");
  }
  pybind11::object::~object((object *)&stack0xffffffffffffff70);
  pybind11::object::~object((object *)&stack0xffffffffffffff90);
  pfVar13 = rec;
LAB_0010bd48:
  psVar18 = &signatures._M_string_length;
  signatures._M_dataplus._M_p = (pointer)0x0;
  signatures._M_string_length = signatures._M_string_length & 0xffffffffffffff00;
  local_50 = (undefined1  [8])psVar18;
  if ((pfVar26 != (function_record *)0x0) && (DAT_00121559 == '\x01')) {
    std::__cxx11::string::append(local_50);
    std::__cxx11::string::append(local_50);
    psVar18 = (size_type *)std::__cxx11::string::append(local_50);
  }
  iVar7 = 0;
  local_118 = (vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
               *)CONCAT44(local_118._4_4_,(int)CONCAT71((int7)((ulong)psVar18 >> 8),1));
  local_120 = pfVar26;
  do {
    if (DAT_00121559 == '\x01') {
      if (0 < iVar7) {
        std::__cxx11::string::append(local_50);
      }
      if (pfVar26 != (function_record *)0x0) {
        uVar27 = iVar7 + 1;
        local_b8 = CONCAT44(local_b8._4_4_,uVar27);
        __val = -uVar27;
        if (0 < (int)uVar27) {
          __val = uVar27;
        }
        __len = 1;
        if (9 < __val) {
          uVar28 = (ulong)__val;
          uVar5 = 4;
          do {
            __len = uVar5;
            uVar8 = (uint)uVar28;
            if (uVar8 < 100) {
              __len = __len - 2;
              goto LAB_0010be3e;
            }
            if (uVar8 < 1000) {
              __len = __len - 1;
              goto LAB_0010be3e;
            }
            if (uVar8 < 10000) goto LAB_0010be3e;
            uVar28 = uVar28 / 10000;
            uVar5 = __len + 4;
          } while (99999 < uVar8);
          __len = __len + 1;
        }
LAB_0010be3e:
        local_90._M_p = (pointer)&stack0xffffffffffffff80;
        std::__cxx11::string::_M_construct
                  ((ulong)&stack0xffffffffffffff70,(char)__len - (char)((int)uVar27 >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  (local_90._M_p + (uVar27 >> 0x1f),__len,__val);
        plVar10 = (long *)std::__cxx11::string::append((char *)&stack0xffffffffffffff70);
        rec = (function_record *)signature.field_2._8_8_;
        pfVar26 = local_120;
        local_70._M_p = (pointer)&stack0xffffffffffffffa0;
        pPVar17 = (PyObject *)(plVar10 + 2);
        if ((PyObject *)*plVar10 == pPVar17) {
          local_60 = pPVar17->ob_refcnt;
          uStack_58 = plVar10[3];
        }
        else {
          local_60 = pPVar17->ob_refcnt;
          local_70._M_p = (pointer)*plVar10;
        }
        iVar7 = (int)local_b8;
        rec_capsule_1.super_object.super_handle.m_ptr = (object)((handle *)(plVar10 + 1))->m_ptr;
        *plVar10 = (long)pPVar17;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        std::__cxx11::string::_M_append(local_50,(ulong)local_70._M_p);
        if ((PyObject *)local_70._M_p != (PyObject *)&stack0xffffffffffffffa0) {
          operator_delete(local_70._M_p,local_60 + 1);
        }
        if (local_90._M_p != (pointer)&stack0xffffffffffffff80) {
          operator_delete(local_90._M_p,local_80 + 1);
        }
      }
      std::__cxx11::string::append(local_50);
      std::__cxx11::string::append(local_50);
      std::__cxx11::string::append(local_50);
    }
    if (((pfVar13->doc != (char *)0x0) && (*pfVar13->doc != '\0')) &&
       (options::global_state()::instance == '\x01')) {
      if (DAT_00121559 == '\0') {
        if (((ulong)local_118 & 1) == 0) {
          std::__cxx11::string::append(local_50);
        }
        else {
          local_118 = (vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                       *)((ulong)local_118 & 0xffffffff00000000);
        }
      }
      if (DAT_00121559 == '\x01') {
        std::__cxx11::string::append(local_50);
      }
      std::__cxx11::string::append(local_50);
      if (DAT_00121559 == '\x01') {
        std::__cxx11::string::append(local_50);
      }
    }
    pfVar13 = pfVar13->next;
    if (pfVar13 == (function_record *)0x0) {
      pPVar17 = (local_110->super_function).super_object.super_handle.m_ptr;
      __ptr = *(void **)(pPVar17[1].ob_refcnt + 0x18);
      if (__ptr != (void *)0x0) {
        free(__ptr);
      }
      pcVar9 = strdup((char *)local_50);
      *(char **)(pPVar17[1].ob_refcnt + 0x18) = pcVar9;
      if ((rec->field_0x59 & 0x40) != 0) {
        pPVar19 = (PyObject *)
                  PyInstanceMethod_New((local_110->super_function).super_object.super_handle.m_ptr);
        (local_110->super_function).super_object.super_handle.m_ptr = pPVar19;
        if (pPVar19 == (PyObject *)0x0) {
          pybind11_fail("cpp_function::cpp_function(): Could not allocate instance method object");
        }
        pPVar17->ob_refcnt = pPVar17->ob_refcnt + -1;
        if (pPVar17->ob_refcnt == 0) {
          _Py_Dealloc(pPVar17);
        }
      }
      if (local_50 != (undefined1  [8])&signatures._M_string_length) {
        operator_delete((void *)local_50,signatures._M_string_length + 1);
      }
      if (local_108 != (undefined1  [8])&signature._M_string_length) {
        operator_delete((void *)local_108,
                        CONCAT71(signature._M_string_length._1_7_,
                                 (undefined1)signature._M_string_length) + 1);
      }
      return;
    }
  } while( true );
}

Assistant:

void initialize_generic(detail::function_record *rec, const char *text,
                            const std::type_info *const *types, size_t args) {

        /* Create copies of all referenced C-style strings */
        rec->name = strdup(rec->name ? rec->name : "");
        if (rec->doc) rec->doc = strdup(rec->doc);
        for (auto &a: rec->args) {
            if (a.name)
                a.name = strdup(a.name);
            if (a.descr)
                a.descr = strdup(a.descr);
            else if (a.value)
                a.descr = strdup(a.value.attr("__repr__")().cast<std::string>().c_str());
        }

        rec->is_constructor = !strcmp(rec->name, "__init__") || !strcmp(rec->name, "__setstate__");

#if !defined(NDEBUG) && !defined(PYBIND11_DISABLE_NEW_STYLE_INIT_WARNING)
        if (rec->is_constructor && !rec->is_new_style_constructor) {
            const auto class_name = std::string(((PyTypeObject *) rec->scope.ptr())->tp_name);
            const auto func_name = std::string(rec->name);
            PyErr_WarnEx(
                PyExc_FutureWarning,
                ("pybind11-bound class '" + class_name + "' is using an old-style "
                 "placement-new '" + func_name + "' which has been deprecated. See "
                 "the upgrade guide in pybind11's docs. This message is only visible "
                 "when compiled in debug mode.").c_str(), 0
            );
        }
#endif

        /* Generate a proper function signature */
        std::string signature;
        size_t type_index = 0, arg_index = 0;
        for (auto *pc = text; *pc != '\0'; ++pc) {
            const auto c = *pc;

            if (c == '{') {
                // Write arg name for everything except *args and **kwargs.
                if (*(pc + 1) == '*')
                    continue;

                if (arg_index < rec->args.size() && rec->args[arg_index].name) {
                    signature += rec->args[arg_index].name;
                } else if (arg_index == 0 && rec->is_method) {
                    signature += "self";
                } else {
                    signature += "arg" + std::to_string(arg_index - (rec->is_method ? 1 : 0));
                }
                signature += ": ";
            } else if (c == '}') {
                // Write default value if available.
                if (arg_index < rec->args.size() && rec->args[arg_index].descr) {
                    signature += " = ";
                    signature += rec->args[arg_index].descr;
                }
                arg_index++;
            } else if (c == '%') {
                const std::type_info *t = types[type_index++];
                if (!t)
                    pybind11_fail("Internal error while parsing type signature (1)");
                if (auto tinfo = detail::get_type_info(*t)) {
                    handle th((PyObject *) tinfo->type);
                    signature +=
                        th.attr("__module__").cast<std::string>() + "." +
                        th.attr("__qualname__").cast<std::string>(); // Python 3.3+, but we backport it to earlier versions
                } else if (rec->is_new_style_constructor && arg_index == 0) {
                    // A new-style `__init__` takes `self` as `value_and_holder`.
                    // Rewrite it to the proper class type.
                    signature +=
                        rec->scope.attr("__module__").cast<std::string>() + "." +
                        rec->scope.attr("__qualname__").cast<std::string>();
                } else {
                    std::string tname(t->name());
                    detail::clean_type_id(tname);
                    signature += tname;
                }
            } else {
                signature += c;
            }
        }
        if (arg_index != args || types[type_index] != nullptr)
            pybind11_fail("Internal error while parsing type signature (2)");

#if PY_MAJOR_VERSION < 3
        if (strcmp(rec->name, "__next__") == 0) {
            std::free(rec->name);
            rec->name = strdup("next");
        } else if (strcmp(rec->name, "__bool__") == 0) {
            std::free(rec->name);
            rec->name = strdup("__nonzero__");
        }
#endif
        rec->signature = strdup(signature.c_str());
        rec->args.shrink_to_fit();
        rec->nargs = (std::uint16_t) args;

        if (rec->sibling && PYBIND11_INSTANCE_METHOD_CHECK(rec->sibling.ptr()))
            rec->sibling = PYBIND11_INSTANCE_METHOD_GET_FUNCTION(rec->sibling.ptr());

        detail::function_record *chain = nullptr, *chain_start = rec;
        if (rec->sibling) {
            if (PyCFunction_Check(rec->sibling.ptr())) {
                auto rec_capsule = reinterpret_borrow<capsule>(PyCFunction_GET_SELF(rec->sibling.ptr()));
                chain = (detail::function_record *) rec_capsule;
                /* Never append a method to an overload chain of a parent class;
                   instead, hide the parent's overloads in this case */
                if (!chain->scope.is(rec->scope))
                    chain = nullptr;
            }
            // Don't trigger for things like the default __init__, which are wrapper_descriptors that we are intentionally replacing
            else if (!rec->sibling.is_none() && rec->name[0] != '_')
                pybind11_fail("Cannot overload existing non-function object \"" + std::string(rec->name) +
                        "\" with a function of the same name");
        }

        if (!chain) {
            /* No existing overload was found, create a new function object */
            rec->def = new PyMethodDef();
            std::memset(rec->def, 0, sizeof(PyMethodDef));
            rec->def->ml_name = rec->name;
            rec->def->ml_meth = reinterpret_cast<PyCFunction>(reinterpret_cast<void (*) (void)>(*dispatcher));
            rec->def->ml_flags = METH_VARARGS | METH_KEYWORDS;

            capsule rec_capsule(rec, [](void *ptr) {
                destruct((detail::function_record *) ptr);
            });

            object scope_module;
            if (rec->scope) {
                if (hasattr(rec->scope, "__module__")) {
                    scope_module = rec->scope.attr("__module__");
                } else if (hasattr(rec->scope, "__name__")) {
                    scope_module = rec->scope.attr("__name__");
                }
            }

            m_ptr = PyCFunction_NewEx(rec->def, rec_capsule.ptr(), scope_module.ptr());
            if (!m_ptr)
                pybind11_fail("cpp_function::cpp_function(): Could not allocate function object");
        } else {
            /* Append at the end of the overload chain */
            m_ptr = rec->sibling.ptr();
            inc_ref();
            chain_start = chain;
            if (chain->is_method != rec->is_method)
                pybind11_fail("overloading a method with both static and instance methods is not supported; "
                    #if defined(NDEBUG)
                        "compile in debug mode for more details"
                    #else
                        "error while attempting to bind " + std::string(rec->is_method ? "instance" : "static") + " method " +
                        std::string(pybind11::str(rec->scope.attr("__name__"))) + "." + std::string(rec->name) + signature
                    #endif
                );
            while (chain->next)
                chain = chain->next;
            chain->next = rec;
        }

        std::string signatures;
        int index = 0;
        /* Create a nice pydoc rec including all signatures and
           docstrings of the functions in the overload chain */
        if (chain && options::show_function_signatures()) {
            // First a generic signature
            signatures += rec->name;
            signatures += "(*args, **kwargs)\n";
            signatures += "Overloaded function.\n\n";
        }
        // Then specific overload signatures
        bool first_user_def = true;
        for (auto it = chain_start; it != nullptr; it = it->next) {
            if (options::show_function_signatures()) {
                if (index > 0) signatures += "\n";
                if (chain)
                    signatures += std::to_string(++index) + ". ";
                signatures += rec->name;
                signatures += it->signature;
                signatures += "\n";
            }
            if (it->doc && strlen(it->doc) > 0 && options::show_user_defined_docstrings()) {
                // If we're appending another docstring, and aren't printing function signatures, we
                // need to append a newline first:
                if (!options::show_function_signatures()) {
                    if (first_user_def) first_user_def = false;
                    else signatures += "\n";
                }
                if (options::show_function_signatures()) signatures += "\n";
                signatures += it->doc;
                if (options::show_function_signatures()) signatures += "\n";
            }
        }

        /* Install docstring */
        PyCFunctionObject *func = (PyCFunctionObject *) m_ptr;
        if (func->m_ml->ml_doc)
            std::free(const_cast<char *>(func->m_ml->ml_doc));
        func->m_ml->ml_doc = strdup(signatures.c_str());

        if (rec->is_method) {
            m_ptr = PYBIND11_INSTANCE_METHOD_NEW(m_ptr, rec->scope.ptr());
            if (!m_ptr)
                pybind11_fail("cpp_function::cpp_function(): Could not allocate instance method object");
            Py_DECREF(func);
        }
    }